

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::storeObject
               (RefVectorOf<xercesc_4_0::XercesLocationPath> *objToStore,XSerializeEngine *serEng)

{
  bool bVar1;
  XercesLocationPath *t;
  XercesLocationPath *serObj;
  XercesLocationPath *data;
  XMLSize_t i;
  XMLSize_t vectorLength;
  XSerializeEngine *serEng_local;
  RefVectorOf<xercesc_4_0::XercesLocationPath> *objToStore_local;
  
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar1) {
    t = (XercesLocationPath *)
        BaseRefVectorOf<xercesc_4_0::XercesLocationPath>::size
                  (&objToStore->super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>);
    XSerializeEngine::writeSize(serEng,(XMLSize_t)t);
    for (data = (XercesLocationPath *)0x0; data < t;
        data = (XercesLocationPath *)((long)&(data->super_XSerializable)._vptr_XSerializable + 1)) {
      serObj = BaseRefVectorOf<xercesc_4_0::XercesLocationPath>::elementAt
                         (&objToStore->super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>,
                          (XMLSize_t)data);
      operator<<(serEng,&serObj->super_XSerializable);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(RefVectorOf<XercesLocationPath>* const objToStore
                                    , XSerializeEngine&                      serEng)
{

    if (serEng.needToStoreObject(objToStore))
    {
        XMLSize_t vectorLength = objToStore->size();
        serEng.writeSize (vectorLength);

        for ( XMLSize_t i = 0; i < vectorLength; i++)
        {
            XercesLocationPath* data = objToStore->elementAt(i);
            serEng<<data;
        }
    }

}